

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNodeVector.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMNodeVector::insertElementAt(DOMNodeVector *this,DOMNode *elem,XMLSize_t index)

{
  ulong uVar1;
  ulong uVar2;
  
  if (index <= this->nextFreeSlot) {
    checkSpace(this);
    uVar1 = this->nextFreeSlot;
    for (uVar2 = uVar1; index < uVar2; uVar2 = uVar2 - 1) {
      this->data[uVar2] = this->data[uVar2 - 1];
    }
    this->data[index] = elem;
    this->nextFreeSlot = uVar1 + 1;
    return;
  }
  __assert_fail("index <= nextFreeSlot",
                "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/dom/impl/DOMNodeVector.cpp"
                ,0x5d,"void xercesc_4_0::DOMNodeVector::insertElementAt(DOMNode *, XMLSize_t)");
}

Assistant:

void DOMNodeVector::insertElementAt(DOMNode *elem, XMLSize_t index) {

	assert(index <= nextFreeSlot);

	checkSpace();
	for (XMLSize_t i=nextFreeSlot; i>index; --i) {
		data[i] = data[i-1];
	}
	data[index] = elem;
	++nextFreeSlot;

}